

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O1

ParsedFloat *
absl::strings_internal::ParseFloat<10>
          (ParsedFloat *__return_storage_ptr__,char *begin,char *end,chars_format format_flags)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool *dropped_nonzero_digit;
  int max_digits;
  char *pcVar6;
  char *begin_00;
  byte *pbVar7;
  bool mantissa_is_inexact;
  uint64_t mantissa;
  bool local_41;
  int local_40;
  chars_format local_3c;
  unsigned_long local_38;
  
  __return_storage_ptr__->mantissa = 0;
  __return_storage_ptr__->exponent = 0;
  __return_storage_ptr__->literal_exponent = 0;
  __return_storage_ptr__->type = kNumber;
  __return_storage_ptr__->subrange_begin = (char *)0x0;
  __return_storage_ptr__->subrange_end = (char *)0x0;
  __return_storage_ptr__->end = (char *)0x0;
  if (begin == end) {
    return __return_storage_ptr__;
  }
  bVar2 = anon_unknown_0::ParseInfinityOrNan(begin,end,__return_storage_ptr__);
  if (bVar2) {
    return __return_storage_ptr__;
  }
  begin_00 = begin;
  pcVar6 = begin;
  if (begin < end) {
    do {
      begin_00 = pcVar6;
      if (*begin_00 != '0') break;
      pcVar6 = begin_00 + 1;
      begin_00 = end;
    } while (pcVar6 != end);
  }
  local_38 = 0;
  dropped_nonzero_digit = &local_41;
  local_41 = false;
  local_3c = format_flags;
  iVar3 = absl::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
                    (begin_00,end,0x13,&local_38,dropped_nonzero_digit);
  if (49999999 < iVar3) {
    return __return_storage_ptr__;
  }
  pbVar7 = (byte *)(begin_00 + iVar3);
  max_digits = 0x13 - iVar3;
  if (0x13 < iVar3) {
    max_digits = 0;
  }
  local_40 = iVar3 + -0x13;
  if (iVar3 < 0x14) {
    local_40 = 0;
  }
  if ((pbVar7 < end) && (*pbVar7 == 0x2e)) {
    pbVar7 = pbVar7 + 1;
    pbVar4 = pbVar7;
    pbVar5 = pbVar7;
    if (local_38 == 0) {
      for (; (pbVar4 < end && (pbVar5 = pbVar4, *pbVar4 == 0x30)); pbVar4 = pbVar4 + 1) {
        pbVar5 = (byte *)end;
      }
      iVar3 = (int)pbVar5 - (int)pbVar7;
      if (49999999 < iVar3) {
        return __return_storage_ptr__;
      }
      local_40 = local_40 - iVar3;
      pbVar7 = pbVar5;
    }
    dropped_nonzero_digit = &local_41;
    iVar3 = absl::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
                      ((char *)pbVar7,end,max_digits,&local_38,dropped_nonzero_digit);
    if (iVar3 < max_digits) {
      max_digits = iVar3;
    }
    if (49999999 < iVar3) {
      return __return_storage_ptr__;
    }
    pbVar7 = pbVar7 + iVar3;
    local_40 = local_40 - max_digits;
  }
  if (pbVar7 == (byte *)begin) {
    return __return_storage_ptr__;
  }
  if (((long)pbVar7 - (long)begin == 1) && (*begin == '.')) {
    return __return_storage_ptr__;
  }
  if (local_41 == true) {
    __return_storage_ptr__->subrange_begin = begin;
    __return_storage_ptr__->subrange_end = (char *)pbVar7;
  }
  __return_storage_ptr__->mantissa = local_38;
  __return_storage_ptr__->literal_exponent = 0;
  local_3c = local_3c & general;
  pbVar4 = (byte *)0x0;
  if ((local_3c == fixed) || (end <= pbVar7)) goto LAB_00268836;
  if ((*pbVar7 & 0xdf) != 0x45) {
    pbVar4 = (byte *)0x0;
    goto LAB_00268836;
  }
  piVar1 = &__return_storage_ptr__->literal_exponent;
  pbVar5 = pbVar7 + 1;
  if (pbVar5 < end) {
    if (*pbVar5 != 0x2d) {
      pbVar4 = pbVar7 + 2;
      if (*pbVar5 == 0x2b) {
        pbVar5 = pbVar4;
      }
      goto LAB_002687f5;
    }
    pbVar5 = pbVar7 + 2;
    bVar2 = true;
  }
  else {
LAB_002687f5:
    bVar2 = false;
  }
  iVar3 = absl::(anonymous_namespace)::ConsumeDigits<10,int>
                    ((char *)pbVar5,end,(int)piVar1,(int *)pbVar4,dropped_nonzero_digit);
  pbVar4 = (byte *)(ulong)(iVar3 != 0);
  if (iVar3 != 0) {
    pbVar7 = pbVar5 + iVar3;
  }
  if ((bVar2) && (iVar3 != 0)) {
    *piVar1 = -*piVar1;
    pbVar7 = pbVar5 + iVar3;
  }
LAB_00268836:
  if ((local_3c != scientific) || ((char)pbVar4 != '\0')) {
    __return_storage_ptr__->type = kNumber;
    local_40 = local_40 + __return_storage_ptr__->literal_exponent;
    if (__return_storage_ptr__->mantissa == 0) {
      local_40 = 0;
    }
    __return_storage_ptr__->exponent = local_40;
    __return_storage_ptr__->end = (char *)pbVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

strings_internal::ParsedFloat ParseFloat(const char* begin, const char* end,
                                         chars_format format_flags) {
  strings_internal::ParsedFloat result;

  // Exit early if we're given an empty range.
  if (begin == end) return result;

  // Handle the infinity and NaN cases.
  if (ParseInfinityOrNan(begin, end, &result)) {
    return result;
  }

  const char* const mantissa_begin = begin;
  while (begin < end && *begin == '0') {
    ++begin;  // skip leading zeros
  }
  uint64_t mantissa = 0;

  int exponent_adjustment = 0;
  bool mantissa_is_inexact = false;
  int pre_decimal_digits = ConsumeDigits<base>(
      begin, end, MantissaDigitsMax<base>(), &mantissa, &mantissa_is_inexact);
  begin += pre_decimal_digits;
  int digits_left;
  if (pre_decimal_digits >= DigitLimit<base>()) {
    // refuse to parse pathological inputs
    return result;
  } else if (pre_decimal_digits > MantissaDigitsMax<base>()) {
    // We dropped some non-fraction digits on the floor.  Adjust our exponent
    // to compensate.
    exponent_adjustment =
        static_cast<int>(pre_decimal_digits - MantissaDigitsMax<base>());
    digits_left = 0;
  } else {
    digits_left =
        static_cast<int>(MantissaDigitsMax<base>() - pre_decimal_digits);
  }
  if (begin < end && *begin == '.') {
    ++begin;
    if (mantissa == 0) {
      // If we haven't seen any nonzero digits yet, keep skipping zeros.  We
      // have to adjust the exponent to reflect the changed place value.
      const char* begin_zeros = begin;
      while (begin < end && *begin == '0') {
        ++begin;
      }
      int zeros_skipped = static_cast<int>(begin - begin_zeros);
      if (zeros_skipped >= DigitLimit<base>()) {
        // refuse to parse pathological inputs
        return result;
      }
      exponent_adjustment -= static_cast<int>(zeros_skipped);
    }
    int post_decimal_digits = ConsumeDigits<base>(
        begin, end, digits_left, &mantissa, &mantissa_is_inexact);
    begin += post_decimal_digits;

    // Since `mantissa` is an integer, each significant digit we read after
    // the decimal point requires an adjustment to the exponent. "1.23e0" will
    // be stored as `mantissa` == 123 and `exponent` == -2 (that is,
    // "123e-2").
    if (post_decimal_digits >= DigitLimit<base>()) {
      // refuse to parse pathological inputs
      return result;
    } else if (post_decimal_digits > digits_left) {
      exponent_adjustment -= digits_left;
    } else {
      exponent_adjustment -= post_decimal_digits;
    }
  }
  // If we've found no mantissa whatsoever, this isn't a number.
  if (mantissa_begin == begin) {
    return result;
  }
  // A bare "." doesn't count as a mantissa either.
  if (begin - mantissa_begin == 1 && *mantissa_begin == '.') {
    return result;
  }

  if (mantissa_is_inexact) {
    // We dropped significant digits on the floor.  Handle this appropriately.
    if (base == 10) {
      // If we truncated significant decimal digits, store the full range of the
      // mantissa for future big integer math for exact rounding.
      result.subrange_begin = mantissa_begin;
      result.subrange_end = begin;
    } else if (base == 16) {
      // If we truncated hex digits, reflect this fact by setting the low
      // ("sticky") bit.  This allows for correct rounding in all cases.
      mantissa |= 1;
    }
  }
  result.mantissa = mantissa;

  const char* const exponent_begin = begin;
  result.literal_exponent = 0;
  bool found_exponent = false;
  if (AllowExponent(format_flags) && begin < end &&
      IsExponentCharacter<base>(*begin)) {
    bool negative_exponent = false;
    ++begin;
    if (begin < end && *begin == '-') {
      negative_exponent = true;
      ++begin;
    } else if (begin < end && *begin == '+') {
      ++begin;
    }
    const char* const exponent_digits_begin = begin;
    // Exponent is always expressed in decimal, even for hexadecimal floats.
    begin += ConsumeDigits<10>(begin, end, kDecimalExponentDigitsMax,
                               &result.literal_exponent, nullptr);
    if (begin == exponent_digits_begin) {
      // there were no digits where we expected an exponent.  We failed to read
      // an exponent and should not consume the 'e' after all.  Rewind 'begin'.
      found_exponent = false;
      begin = exponent_begin;
    } else {
      found_exponent = true;
      if (negative_exponent) {
        result.literal_exponent = -result.literal_exponent;
      }
    }
  }

  if (!found_exponent && RequireExponent(format_flags)) {
    // Provided flags required an exponent, but none was found.  This results
    // in a failure to scan.
    return result;
  }

  // Success!
  result.type = strings_internal::FloatType::kNumber;
  if (result.mantissa > 0) {
    result.exponent = result.literal_exponent +
                      (DigitMagnitude<base>() * exponent_adjustment);
  } else {
    result.exponent = 0;
  }
  result.end = begin;
  return result;
}